

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O0

int64_t duckdb::DateSub::WeekOperator::Operation<duckdb::date_t,duckdb::date_t,long>
                  (date_t startdate,date_t enddate)

{
  timestamp_t enddate_00;
  timestamp_t startdate_00;
  long lVar1;
  undefined4 in_ESI;
  dtime_t in_stack_00000010;
  date_t in_stack_0000001c;
  dtime_t t0;
  undefined4 in_stack_ffffffffffffffc8;
  dtime_t local_10;
  undefined4 local_8;
  
  local_8 = in_ESI;
  dtime_t::dtime_t(&local_10,0);
  Timestamp::FromDatetime(in_stack_0000001c,in_stack_00000010);
  startdate_00 = Timestamp::FromDatetime(in_stack_0000001c,in_stack_00000010);
  enddate_00.value._4_4_ = local_8;
  enddate_00.value._0_4_ = in_stack_ffffffffffffffc8;
  lVar1 = Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>(startdate_00,enddate_00);
  return lVar1;
}

Assistant:

int64_t DateSub::WeekOperator::Operation(date_t startdate, date_t enddate) {
	dtime_t t0(0);
	return WeekOperator::Operation<timestamp_t, timestamp_t, int64_t>(Timestamp::FromDatetime(startdate, t0),
	                                                                  Timestamp::FromDatetime(enddate, t0));
}